

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecimalFormatProperties::clear(DecimalFormatProperties *this)

{
  DecimalFormatProperties *this_local;
  
  NullableValue<UNumberCompactStyle>::nullify(&this->compactStyle);
  NullableValue<icu_63::CurrencyUnit>::nullify(&this->currency);
  LocalPointer<icu_63::CurrencyPluralInfo>::adoptInstead
            (&(this->currencyPluralInfo).fPtr,(CurrencyPluralInfo *)0x0);
  NullableValue<UCurrencyUsage>::nullify(&this->currencyUsage);
  this->decimalPatternMatchRequired = false;
  this->decimalSeparatorAlwaysShown = false;
  this->exponentSignAlwaysShown = false;
  this->formatFailIfMoreThanMaxDigits = false;
  this->formatWidth = -1;
  this->groupingSize = -1;
  this->groupingUsed = true;
  this->magnitudeMultiplier = 0;
  this->maximumFractionDigits = -1;
  this->maximumIntegerDigits = -1;
  this->maximumSignificantDigits = -1;
  this->minimumExponentDigits = -1;
  this->minimumFractionDigits = -1;
  this->minimumGroupingDigits = -1;
  this->minimumIntegerDigits = -1;
  this->minimumSignificantDigits = -1;
  this->multiplier = 1;
  this->multiplierScale = 0;
  UnicodeString::setToBogus(&this->negativePrefix);
  UnicodeString::setToBogus(&this->negativePrefixPattern);
  UnicodeString::setToBogus(&this->negativeSuffix);
  UnicodeString::setToBogus(&this->negativeSuffixPattern);
  NullableValue<UNumberFormatPadPosition>::nullify(&this->padPosition);
  UnicodeString::setToBogus(&this->padString);
  this->parseCaseSensitive = false;
  this->parseIntegerOnly = false;
  NullableValue<icu_63::number::impl::ParseMode>::nullify(&this->parseMode);
  this->parseNoExponent = false;
  this->parseToBigDecimal = false;
  this->parseAllInput = UNUM_MAYBE;
  UnicodeString::setToBogus(&this->positivePrefix);
  UnicodeString::setToBogus(&this->positivePrefixPattern);
  UnicodeString::setToBogus(&this->positiveSuffix);
  UnicodeString::setToBogus(&this->positiveSuffixPattern);
  this->roundingIncrement = 0.0;
  NullableValue<UNumberFormatRoundingMode>::nullify(&this->roundingMode);
  this->secondaryGroupingSize = -1;
  this->signAlwaysShown = false;
  return;
}

Assistant:

void DecimalFormatProperties::clear() {
    compactStyle.nullify();
    currency.nullify();
    currencyPluralInfo.fPtr.adoptInstead(nullptr);
    currencyUsage.nullify();
    decimalPatternMatchRequired = false;
    decimalSeparatorAlwaysShown = false;
    exponentSignAlwaysShown = false;
    formatFailIfMoreThanMaxDigits = false;
    formatWidth = -1;
    groupingSize = -1;
    groupingUsed = true;
    magnitudeMultiplier = 0;
    maximumFractionDigits = -1;
    maximumIntegerDigits = -1;
    maximumSignificantDigits = -1;
    minimumExponentDigits = -1;
    minimumFractionDigits = -1;
    minimumGroupingDigits = -1;
    minimumIntegerDigits = -1;
    minimumSignificantDigits = -1;
    multiplier = 1;
    multiplierScale = 0;
    negativePrefix.setToBogus();
    negativePrefixPattern.setToBogus();
    negativeSuffix.setToBogus();
    negativeSuffixPattern.setToBogus();
    padPosition.nullify();
    padString.setToBogus();
    parseCaseSensitive = false;
    parseIntegerOnly = false;
    parseMode.nullify();
    parseNoExponent = false;
    parseToBigDecimal = false;
    parseAllInput = UNUM_MAYBE;
    positivePrefix.setToBogus();
    positivePrefixPattern.setToBogus();
    positiveSuffix.setToBogus();
    positiveSuffixPattern.setToBogus();
    roundingIncrement = 0.0;
    roundingMode.nullify();
    secondaryGroupingSize = -1;
    signAlwaysShown = false;
}